

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O1

ON__UINT64 __thiscall ON_Buffer::Read(ON_Buffer *this,ON__UINT64 size,void *buffer)

{
  ON_BUFFER_SEGMENT *pOVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  ON__UINT64 OVar5;
  char *sFormat;
  ON__UINT64 OVar6;
  ulong uVar7;
  ulong __n;
  
  if (size == 0) {
    return 0;
  }
  if (buffer == (void *)0x0) {
    sFormat = "size parameter > 0 and buffer parameter is null.";
    iVar4 = 0x465;
  }
  else if (this->m_current_position < this->m_buffer_size) {
    bVar3 = SetCurrentSegment(this,false);
    if (bVar3) {
      OVar6 = 0;
      while( true ) {
        if (size == 0) {
          return OVar6;
        }
        pOVar1 = this->m_current_segment;
        if ((pOVar1 == (ON_BUFFER_SEGMENT *)0x0) || (pOVar1->m_segment_buffer == (uchar *)0x0))
        break;
        uVar2 = this->m_current_position;
        uVar7 = pOVar1->m_segment_position1;
        if (this->m_buffer_size < pOVar1->m_segment_position1) {
          uVar7 = this->m_buffer_size;
        }
        __n = uVar7 - uVar2;
        if (uVar2 < pOVar1->m_segment_position0 || (uVar7 < uVar2 || __n == 0)) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                     ,0x48c,"","Corrupt ON_Buffer");
          iVar4 = 1;
        }
        else {
          if (size <= __n) {
            __n = size;
          }
          memcpy(buffer,pOVar1->m_segment_buffer + (uVar2 - pOVar1->m_segment_position0),__n);
          OVar5 = this->m_current_position + __n;
          this->m_current_position = OVar5;
          OVar6 = OVar6 + __n;
          buffer = (void *)((long)buffer + __n);
          iVar4 = 0;
          size = size - __n;
          if (size != 0) {
            if ((OVar5 == this->m_buffer_size) && (this->m_current_segment == this->m_last_segment))
            {
              iVar4 = 3;
            }
            else {
              this->m_current_segment = this->m_current_segment->m_next_segment;
            }
          }
        }
        if (iVar4 != 0) {
          if (iVar4 != 3) {
            return 0;
          }
          return OVar6;
        }
      }
      sFormat = "Corrupt ON_Buffer";
      iVar4 = 0x482;
    }
    else {
      sFormat = "Corrupt ON_Buffer";
      iVar4 = 0x479;
    }
  }
  else {
    if (this->m_current_position <= this->m_buffer_size) {
      return 0;
    }
    sFormat = "Read attempted when current position > buffer size.";
    iVar4 = 0x472;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
             ,iVar4,"",sFormat);
  return 0;
}

Assistant:

ON__UINT64 ON_Buffer::Read( ON__UINT64 size, void* buffer )
{
  if ( 0 == size )
  {
    // not an error condition
    return 0;
  }

  if ( 0 == buffer )
  {
    // ON_Buffer error
    ON_ERROR("size parameter > 0 and buffer parameter is null.");
    return 0;
  }

  if ( m_current_position >= m_buffer_size )
  {
    // m_current_position == m_buffer_size is a common situation
    // and is not an error condition.
    // For example, it occurs when a previous Read() read up to the
    // end of the buffer and the caller is testing the number of 
    // bytes read to detect the end of buffer condition.
    if ( m_current_position > m_buffer_size )
    {
      ON_ERROR("Read attempted when current position > buffer size.");
    }
    return 0;
  }

  if ( !SetCurrentSegment(false) )
  {
    ON_ERROR("Corrupt ON_Buffer");
    return 0;
  }

  ON__UINT64 rc = 0;
  while ( size > 0 )
  {
    if( 0 == m_current_segment || 0 == m_current_segment->m_segment_buffer )
    {
      ON_ERROR("Corrupt ON_Buffer");
      return 0;
    }

    // set pos1 to the maximum position to be read from m_current_segment.
    ON__UINT64 pos1 = (m_buffer_size < m_current_segment->m_segment_position1)
                    ? m_buffer_size
                    : m_current_segment->m_segment_position1;
    if ( m_current_position < m_current_segment->m_segment_position0 || m_current_position >= pos1 )
    {
      ON_ERROR("Corrupt ON_Buffer");
      return 0;
    }

    ON__UINT64 offset = m_current_position - m_current_segment->m_segment_position0;           
    ON__UINT64 sz = pos1 - m_current_position;

    if ( sz > size )
      sz = size;
    memcpy( buffer, m_current_segment->m_segment_buffer + offset, (size_t)sz );
    m_current_position += sz;
    rc += sz;
    size -= sz;
    buffer = ((unsigned char*)buffer) + sz;
    if ( size > 0 )
    {
      if ( m_current_position == m_buffer_size && m_current_segment == m_last_segment )
      {
        // This is a common situation that occurs when the read request is for a
        // size larger than the remaining number of bytes in the buffer. For example,
        // when repeatedly reading into a fixed size buffer until reaching the end
        // of the file. This is not an error condition.
        break;
      }
      m_current_segment = m_current_segment->m_next_segment;
    }
  }

  return rc;
}